

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int get_zero_bits_MSB(cram_block *block)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int local_14;
  int b;
  int n;
  cram_block *block_local;
  
  local_14 = 0;
  iVar3 = local_14;
  do {
    local_14 = iVar3;
    bVar1 = block->data[block->byte];
    iVar2 = block->bit;
    iVar3 = block->bit + -1;
    block->bit = iVar3;
    if (iVar3 == -1) {
      block->bit = 7;
      block->byte = block->byte + 1;
    }
    iVar3 = local_14 + 1;
  } while (((int)(uint)bVar1 >> ((byte)iVar2 & 0x1f) & 1U) == 0);
  return local_14;
}

Assistant:

static int get_zero_bits_MSB(cram_block *block) {
    int n = 0, b;
    do {
	b = block->data[block->byte] >> block->bit;
	if (--block->bit == -1) {
	    block->bit = 7;
	    block->byte++;
	}
	n++;
    } while (!(b&1));

    return n-1;
}